

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::accept
          (AggregateConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *local_18;
  AggregateConnectionReceiver *this_local;
  
  local_18 = (Own<kj::ConnectionReceiver,_std::nullptr_t> *)CONCAT44(in_register_00000034,__fd);
  this_local = this;
  acceptAuthenticated((AggregateConnectionReceiver *)&stack0xffffffffffffffe0);
  Promise<kj::AuthenticatedStream>::
  then<kj::(anonymous_namespace)::AggregateConnectionReceiver::accept()::_lambda(kj::AuthenticatedStream&&)_1_>
            ((Promise<kj::AuthenticatedStream> *)this,(Type *)&stack0xffffffffffffffe0);
  Promise<kj::AuthenticatedStream>::~Promise
            ((Promise<kj::AuthenticatedStream> *)&stack0xffffffffffffffe0);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> accept() override {
    return acceptAuthenticated().then([](AuthenticatedStream&& authenticated) {
      return kj::mv(authenticated.stream);
    });
  }